

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O2

int64_t __thiscall aeron::DriverProxy::clientClose(DriverProxy *this)

{
  long *plVar1;
  int64_t correlationId;
  anon_class_16_2_3aef6e2a local_18;
  
  LOCK();
  plVar1 = (long *)(this->m_toDriverCommandBuffer->m_buffer->m_buffer +
                   this->m_toDriverCommandBuffer->m_correlationIdCounterIndex);
  correlationId = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  local_18.correlationId = &correlationId;
  local_18.this = this;
  writeCommandToDriver<aeron::DriverProxy::clientClose()::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_18);
  return correlationId;
}

Assistant:

std::int64_t clientClose()
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer& buffer, util::index_t& length)
        {
            CorrelatedMessageFlyweight correlatedMessage(buffer, 0);

            correlatedMessage.clientId(m_clientId);
            correlatedMessage.correlationId(correlationId);

            length = CORRELATED_MESSAGE_LENGTH;

            return ControlProtocolEvents::CLIENT_CLOSE;
        });

        return correlationId;
    }